

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<int,int,int,duckdb::BinaryNumericDivideWrapper,duckdb::DivideOperator,bool,false,true>
               (int *ldata,int *rdata,int *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong idx;
  ulong uVar6;
  unsigned_long uVar7;
  idx_t idx_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = *rdata;
      idx_00 = 0;
      do {
        iVar2 = BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,int,int,int>
                          (fun,ldata[idx_00],iVar3,mask,idx_00);
        result_data[idx_00] = iVar2;
        idx_00 = idx_00 + 1;
      } while (count != idx_00);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    idx = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar1[uVar4];
      }
      uVar6 = idx + 0x40;
      if (count <= idx + 0x40) {
        uVar6 = count;
      }
      uVar5 = uVar6;
      if (uVar7 != 0) {
        uVar5 = idx;
        if (uVar7 == 0xffffffffffffffff) {
          if (idx < uVar6) {
            iVar3 = *rdata;
            do {
              iVar2 = BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,int,int,int>
                                (fun,ldata[idx],iVar3,mask,idx);
              result_data[idx] = iVar2;
              idx = idx + 1;
              uVar5 = idx;
            } while (uVar6 != idx);
          }
        }
        else if (idx < uVar6) {
          uVar5 = 0;
          do {
            if ((uVar7 >> (uVar5 & 0x3f) & 1) != 0) {
              iVar3 = BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,int,int,int>
                                (fun,ldata[idx + uVar5],*rdata,mask,uVar5 + idx);
              result_data[idx + uVar5] = iVar3;
            }
            uVar5 = uVar5 + 1;
          } while ((idx - uVar6) + uVar5 != 0);
          uVar5 = idx + uVar5;
        }
      }
      uVar4 = uVar4 + 1;
      idx = uVar5;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}